

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>
slang::ast::Statement::createAndAddBlockItems
          (Scope *scope,SyntaxList<slang::syntax::SyntaxNode> *items)

{
  SyntaxNode *this;
  SourceRange sourceRange;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  iterator this_00;
  reference ppSVar4;
  Symbol *pSVar5;
  Compilation *this_01;
  undefined4 extraout_var;
  iterator ppSVar6;
  EVP_PKEY_CTX *src;
  Symbol *this_03;
  SourceLocation in_RSI;
  Scope *in_RDI;
  SourceRange SVar7;
  bool in_stack_00000017;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *in_stack_00000018;
  SmallVectorBase<const_slang::ast::StatementBlockSymbol_*> *in_stack_00000020;
  StatementSyntax *in_stack_00000028;
  Scope *in_stack_00000030;
  SyntaxNode *member;
  iterator __end2_2;
  iterator __begin2_2;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *__range2_2;
  StatementBlockSymbol *block;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL> *__range2_1;
  span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL> blocks;
  FormalArgumentSymbol *arg;
  iterator __end5;
  iterator __begin5;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *__range5;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> args;
  SyntaxNode *item;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::SyntaxNode> *__range2;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> extraMembers;
  SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL> buffer;
  SyntaxNode *in_stack_00000468;
  Scope *in_stack_00000470;
  Symbol *in_stack_fffffffffffffe08;
  Scope *in_stack_fffffffffffffe10;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *in_stack_fffffffffffffe18;
  Scope *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe60;
  SyntaxKind SVar8;
  iterator local_188;
  __normal_iterator<const_slang::ast::StatementBlockSymbol_**,_std::span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL>_>
  local_168;
  Scope **local_160;
  Scope *local_158 [2];
  SourceRange local_148;
  undefined4 local_134;
  FormalArgumentSymbol *local_130;
  iterator local_128;
  iterator local_120;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *local_118;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *in_stack_fffffffffffffef0;
  PortDeclarationSyntax *in_stack_fffffffffffffef8;
  Scope *in_stack_ffffffffffffff00;
  SourceLocation SVar9;
  DiagCode in_stack_ffffffffffffff64;
  SmallVectorBase<const_slang::ast::StatementBlockSymbol_*> local_60 [2];
  SourceLocation local_20;
  Scope *local_18;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> local_10;
  Scope *this_02;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL> *)0x4b4f94);
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *)0x4b4fa1);
  iVar3 = std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::begin
                    ((span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *)
                     in_stack_fffffffffffffe08);
  this_00 = std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::end
                      (in_stack_fffffffffffffe18);
  SVar9 = local_20;
  do {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe10,
                       (__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe08);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_01 = Scope::getCompilation(local_18);
      iVar2 = SmallVectorBase<const_slang::ast::StatementBlockSymbol_*>::copy
                        (local_60,(EVP_PKEY_CTX *)this_01,src);
      this_02 = (Scope *)CONCAT44(extraout_var,iVar2);
      local_160 = local_158;
      pSVar5 = this_03;
      local_158[0] = this_02;
      local_168._M_current =
           (StatementBlockSymbol **)
           std::span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL> *)
                      this_03);
      std::span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL>::end
                ((span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL> *)this_01);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_slang::ast::StatementBlockSymbol_**,_std::span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::StatementBlockSymbol_**,_std::span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL>_>
                            *)this_02,
                           (__normal_iterator<const_slang::ast::StatementBlockSymbol_**,_std::span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL>_>
                            *)pSVar5);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::StatementBlockSymbol_**,_std::span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL>_>
        ::operator*(&local_168);
        Scope::addMember(this_02,pSVar5);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::StatementBlockSymbol_**,_std::span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL>_>
        ::operator++(&local_168);
      }
      local_188 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::begin
                            ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)
                             &stack0xffffffffffffff60);
      ppSVar6 = SmallVectorBase<const_slang::syntax::SyntaxNode_*>::end
                          ((SmallVectorBase<const_slang::syntax::SyntaxNode_*> *)
                           &stack0xffffffffffffff60);
      for (; local_188 != ppSVar6; local_188 = local_188 + 1) {
        Scope::addMembers(in_stack_00000470,in_stack_00000468);
      }
      std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>::
      span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL>
                ((span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *)
                 in_stack_fffffffffffffe20,
                 (span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL> *)this_01);
      SmallVector<const_slang::syntax::SyntaxNode_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *)0x4b5456);
      SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL> *)0x4b5463);
      return local_10;
    }
    ppSVar4 = __gnu_cxx::
              __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffff50);
    this = *ppSVar4;
    SVar8 = this->kind;
    if ((((SVar8 == DataDeclaration) || (SVar8 == ForwardTypedefDeclaration)) ||
        (SVar8 == LetDeclaration)) ||
       (((SVar8 == NetTypeDeclaration || (SVar8 == PackageImportDeclaration)) ||
        (SVar8 == ParameterDeclarationStatement)))) {
LAB_004b508f:
      Scope::addMembers(in_stack_00000470,in_stack_00000468);
    }
    else if (SVar8 == PortDeclaration) {
      if (this->previewNode != (SyntaxNode *)0x0) {
        Scope::addMembers(in_stack_00000470,in_stack_00000468);
      }
      pSVar5 = Scope::asSymbol(local_18);
      if (pSVar5->kind == Subroutine) {
        SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::SmallVector
                  ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x4b511f);
        slang::syntax::SyntaxNode::as<slang::syntax::PortDeclarationSyntax>(this);
        FormalArgumentSymbol::fromSyntax
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        local_118 = (SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)
                    &stack0xfffffffffffffef0;
        local_120 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::begin(local_118);
        local_128 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::end(local_118);
        for (; local_120 != local_128; local_120 = local_120 + 1) {
          local_130 = *local_120;
          Scope::addMember(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        }
        SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::~SmallVector
                  ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x4b521a);
      }
      else {
        local_134 = 0x4f0008;
        SVar7 = slang::syntax::SyntaxNode::sourceRange
                          ((SyntaxNode *)CONCAT44(SVar8,in_stack_fffffffffffffe60));
        sourceRange.endLoc = SVar9;
        sourceRange.startLoc = (SourceLocation)iVar3._M_current;
        local_148 = SVar7;
        Scope::addDiag((Scope *)this_00._M_current,in_stack_ffffffffffffff64,sourceRange);
      }
    }
    else {
      if (SVar8 == TypedefDeclaration) goto LAB_004b508f;
      in_stack_fffffffffffffe20 = local_18;
      slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this);
      findBlocks(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                 in_stack_00000017);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffff50);
  } while( true );
}

Assistant:

std::span<const StatementBlockSymbol* const> Statement::createAndAddBlockItems(
    Scope& scope, const SyntaxList<SyntaxNode>& items) {

    SmallVector<const StatementBlockSymbol*> buffer;
    SmallVector<const SyntaxNode*> extraMembers;
    for (auto item : items) {
        switch (item->kind) {
            case SyntaxKind::DataDeclaration:
            case SyntaxKind::TypedefDeclaration:
            case SyntaxKind::ForwardTypedefDeclaration:
            case SyntaxKind::PackageImportDeclaration:
            case SyntaxKind::ParameterDeclarationStatement:
            case SyntaxKind::LetDeclaration:
            case SyntaxKind::NetTypeDeclaration:
                scope.addMembers(*item);
                break;
            case SyntaxKind::PortDeclaration:
                if (item->previewNode)
                    scope.addMembers(*item->previewNode);

                if (scope.asSymbol().kind == SymbolKind::Subroutine) {
                    SmallVector<const FormalArgumentSymbol*> args;
                    FormalArgumentSymbol::fromSyntax(scope, item->as<PortDeclarationSyntax>(),
                                                     args);
                    for (auto arg : args)
                        scope.addMember(*arg);
                }
                else {
                    scope.addDiag(diag::UnexpectedPortDecl, item->sourceRange());
                }
                break;
            default:
                findBlocks(scope, item->as<StatementSyntax>(), buffer, extraMembers, false);
                break;
        }
    }

    auto blocks = buffer.copy(scope.getCompilation());
    for (auto block : blocks)
        scope.addMember(*block);
    for (auto member : extraMembers)
        scope.addMembers(*member);

    return blocks;
}